

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

string * __thiscall
slang::CommandLine::Option::set_abi_cxx11_
          (string *__return_storage_ptr__,Option *this,vector<long,_std::allocator<long>_> *target,
          string_view name,string_view value)

{
  bool bVar1;
  long *__x;
  optional<long> oVar2;
  _Storage<long,_true> local_48;
  optional<long> result;
  vector<long,_std::allocator<long>_> *target_local;
  Option *this_local;
  string_view name_local;
  string *error;
  
  result.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._15_1_
       = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  oVar2 = parseInt<long>(name,value,__return_storage_ptr__);
  local_48._M_value =
       oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_payload;
  result.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value._0_1_ =
       oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_engaged;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_48);
  if (bVar1) {
    __x = std::optional<long>::operator*((optional<long> *)&local_48);
    std::vector<long,_std::allocator<long>_>::push_back(target,__x);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::Option::set(std::vector<int64_t>& target, string_view name,
                                     string_view value) {
    std::string error;
    auto result = parseInt<int64_t>(name, value, error);
    if (result)
        target.push_back(*result);
    return error;
}